

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8e_api_v2.c
# Opt level: O2

MPP_RET vp8e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  undefined8 uVar4;
  uint uVar5;
  RK_U32 change;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  MPP_RET MVar9;
  undefined4 *puVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  
  lVar2 = *ctx;
  if (((byte)vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","enter ctx %p cmd %x param %p\n","vp8e_proc_cfg",ctx,cmd,param);
  }
  if (cmd == MPP_ENC_SET_CFG) {
    uVar7 = *(uint *)((long)param + 0x10);
    MVar9 = MPP_OK;
    if (uVar7 != 0) {
      if ((uVar7 & 4) != 0) {
        uVar11 = *(uint *)((long)param + 0x2c);
        MVar9 = MPP_OK;
        if (0x1000f < uVar11 || uVar11 - 0x14 < 0xffec) {
          _mpp_log_l(2,"vp8e_api_v2","invalid format %d\n",(char *)0x0);
          uVar11 = *(uint *)((long)param + 0x2c);
          MVar9 = MPP_NOK;
        }
        *(uint *)(lVar2 + 0x24) = uVar11;
      }
      if ((uVar7 & 0x10) != 0) {
        *(undefined4 *)(lVar2 + 0x54) = *(undefined4 *)((long)param + 0x5c);
      }
      if ((uVar7 & 0x20) != 0) {
        *(undefined4 *)(lVar2 + 0x5c) = *(undefined4 *)((long)param + 100);
      }
      if ((uVar7 & 0x40) != 0) {
        *(undefined4 *)(lVar2 + 0x60) = *(undefined4 *)((long)param + 0x68);
      }
      uVar11 = *(uint *)(lVar2 + 0x54);
      uVar12 = *(uint *)(lVar2 + 0x5c);
      if (((int)uVar12 < 0 || 3 < uVar11) || (iVar1 = *(int *)(lVar2 + 0x60), iVar1 < 0)) {
        _mpp_log_l(2,"vp8e_api_v2","invalid trans: rotation %d, mirroring %d\n",(char *)0x0);
        uVar11 = *(uint *)(lVar2 + 0x54);
        uVar12 = *(uint *)(lVar2 + 0x5c);
        iVar1 = *(int *)(lVar2 + 0x60);
        MVar9 = MPP_ERR_VALUE;
      }
      uVar6 = uVar11 & 3 ^ 2;
      uVar5 = (uint)(uVar12 == 0);
      if (iVar1 == 0) {
        uVar6 = uVar11;
        uVar5 = uVar12;
      }
      *(uint *)(lVar2 + 0x58) = uVar5;
      *(uint *)(lVar2 + 0x50) = uVar6;
      if ((uVar7 & 0x11) != 0) {
        if ((0x1e00 < *(uint *)((long)param + 0x1c) ||
             (0xf00 < *(uint *)((long)param + 0x18) || 0x780 < *(uint *)((long)param + 0x14))) ||
           (0xf00 < *(uint *)((long)param + 0x20))) {
          _mpp_log_l(2,"vp8e_api_v2","invalid input w:h [%d:%d] [%d:%d]\n",(char *)0x0,
                     (ulong)*(uint *)((long)param + 0x14),(ulong)*(uint *)((long)param + 0x18),
                     (ulong)*(uint *)((long)param + 0x1c),(ulong)*(uint *)((long)param + 0x20));
          uVar6 = *(uint *)(lVar2 + 0x50);
          MVar9 = MPP_NOK;
        }
        puVar10 = (undefined4 *)((long)param + 0x14);
        puVar8 = (undefined4 *)((long)param + 0x18);
        if ((uVar6 | 2) == 3) {
          puVar8 = puVar10;
          puVar10 = (undefined4 *)((long)param + 0x18);
        }
        *(undefined4 *)(lVar2 + 0xc) = *puVar10;
        *(undefined4 *)(lVar2 + 0x10) = *puVar8;
        *(undefined8 *)(lVar2 + 0x14) = *(undefined8 *)((long)param + 0x1c);
      }
      *(uint *)(lVar2 + 8) = *(uint *)(lVar2 + 8) | *(uint *)((long)param + 0x10);
      if ((uVar6 | 2) == 3) {
        uVar7 = *(uint *)(lVar2 + 0xc);
        uVar11 = *(uint *)(lVar2 + 0x10);
        uVar12 = *(uint *)(lVar2 + 0x14);
        bVar3 = (int)uVar12 < (int)uVar11;
        uVar6 = *(uint *)(lVar2 + 0x18);
        bVar14 = SBORROW4(uVar7,uVar6);
        iVar1 = uVar7 - uVar6;
        bVar13 = uVar7 == uVar6;
      }
      else {
        uVar7 = *(uint *)(lVar2 + 0xc);
        uVar11 = *(uint *)(lVar2 + 0x10);
        uVar12 = *(uint *)(lVar2 + 0x14);
        bVar3 = (int)uVar12 < (int)uVar7;
        uVar6 = *(uint *)(lVar2 + 0x18);
        bVar14 = SBORROW4(uVar11,uVar6);
        iVar1 = uVar11 - uVar6;
        bVar13 = uVar11 == uVar6;
      }
      if ((bool)((!bVar13 && bVar14 == iVar1 < 0) | bVar3)) {
        _mpp_log_l(2,"vp8e_api_v2","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,
                   (ulong)uVar7,(ulong)uVar11,(ulong)uVar12,(ulong)uVar6);
        MVar9 = MPP_ERR_VALUE;
      }
      if (((byte)vp8e_debug & 2) != 0) {
        _mpp_log_l(4,"vp8e_api_v2","width %d height %d hor_stride %d ver_srtride %d format 0x%x\n",
                   "vp8e_proc_prep_cfg",(ulong)*(uint *)(lVar2 + 0xc),(ulong)*(uint *)(lVar2 + 0x10)
                   ,(ulong)*(uint *)(lVar2 + 0x14),(ulong)*(uint *)(lVar2 + 0x18),
                   (ulong)*(uint *)(lVar2 + 0x24));
      }
      *(undefined4 *)((long)param + 0x10) = 0;
    }
    uVar7 = *(uint *)((long)param + 0x350);
    if (uVar7 != 0) {
      if ((uVar7 & 1) != 0) {
        uVar4 = *(undefined8 *)((long)param + 0x360);
        *(undefined8 *)(lVar2 + 0x350) = *(undefined8 *)((long)param + 0x358);
        *(undefined8 *)(lVar2 + 0x358) = uVar4;
        *(undefined4 *)(lVar2 + 0x360) = *(undefined4 *)((long)param + 0x368);
      }
      if ((uVar7 & 2) != 0) {
        *(undefined4 *)(lVar2 + 0x368) = *(undefined4 *)((long)param + 0x370);
      }
      if (((byte)vp8e_debug & 2) != 0) {
        _mpp_log_l(4,"vp8e_api_v2",
                   "rc cfg qp_init %d qp_max %d qp_min %d qp_max_i %d qp_min_i %d, disable_ivf %d\n"
                   ,"vp8e_proc_vp8_cfg",(ulong)*(uint *)(lVar2 + 0x350),
                   (ulong)*(uint *)(lVar2 + 0x354),(ulong)*(uint *)(lVar2 + 0x35c),
                   (ulong)*(uint *)(lVar2 + 0x358),(ulong)*(uint *)(lVar2 + 0x360),
                   (ulong)*(uint *)(lVar2 + 0x368));
        uVar7 = *(uint *)((long)param + 0x350);
      }
      *(uint *)(lVar2 + 0x348) = *(uint *)(lVar2 + 0x348) | uVar7;
      *(undefined4 *)((long)param + 0x350) = 0;
    }
    uVar7 = *(uint *)((long)param + 0xe98);
    if (uVar7 != 0) {
      if ((uVar7 & 1) != 0) {
        *(undefined8 *)(lVar2 + 0xe94) = *(undefined8 *)((long)param + 0xe9c);
      }
      if ((uVar7 & 2) != 0) {
        *(undefined4 *)(lVar2 + 0xe98) = *(undefined4 *)((long)param + 0xea0);
      }
      *(uint *)(lVar2 + 0xe90) = *(uint *)(lVar2 + 0xe90) | uVar7;
      *(undefined4 *)((long)param + 0xe98) = 0;
    }
  }
  else {
    MVar9 = MPP_NOK;
    _mpp_log_l(2,"vp8e_api_v2","No correspond cmd found, and can not config!",(char *)0x0);
  }
  if (((byte)vp8e_debug & 1) != 0) {
    _mpp_log_l(4,"vp8e_api_v2","leave ret %d\n","vp8e_proc_cfg",(ulong)(uint)MVar9);
  }
  return MVar9;
}

Assistant:

static MPP_RET vp8e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    Vp8eCtx *p = (Vp8eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;
    MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
    MppEncCfgSet *src = &impl->cfg;

    vp8e_dbg_fun("enter ctx %p cmd %x param %p\n", ctx, cmd, param);
    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        if (src->prep.change) {
            ret |= vp8e_proc_prep_cfg(&cfg->prep, &src->prep);
            src->prep.change = 0;
        }
        if (src->codec.vp8.change) {
            ret |= vp8e_proc_vp8_cfg(&cfg->codec.vp8, &src->codec.vp8);
            src->codec.vp8.change = 0;
        }
        if (src->split.change) {
            ret |= vp8e_proc_split_cfg(&cfg->split, &src->split);
            src->split.change = 0;
        }
    } break;
    default: {
        mpp_err("No correspond cmd found, and can not config!");
        ret = MPP_NOK;
    } break;
    }

    vp8e_dbg_fun("leave ret %d\n", ret);
    return ret;
}